

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O0

void __thiscall
btTriangleMesh::btTriangleMesh(btTriangleMesh *this,bool use32bitIndices,bool use4componentVertices)

{
  int iVar1;
  btIndexedMesh *pbVar2;
  byte in_DL;
  byte in_SIL;
  undefined8 *in_RDI;
  btIndexedMesh meshIndex;
  btAlignedObjectArray<btVector3> *in_stack_fffffffffffffee0;
  btIndexedMesh *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  btIndexedMesh local_50;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  btTriangleIndexVertexArray::btTriangleIndexVertexArray
            ((btTriangleIndexVertexArray *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  *in_RDI = &PTR__btTriangleMesh_002e5d68;
  btAlignedObjectArray<btVector3>::btAlignedObjectArray(in_stack_fffffffffffffee0);
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)in_stack_fffffffffffffee0);
  btAlignedObjectArray<unsigned_int>::btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_int> *)in_stack_fffffffffffffee0);
  btAlignedObjectArray<unsigned_short>::btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_short> *)in_stack_fffffffffffffee0);
  *(byte *)(in_RDI + 0x1d) = local_9 & 1;
  *(byte *)((long)in_RDI + 0xe9) = local_a & 1;
  *(undefined4 *)((long)in_RDI + 0xec) = 0;
  btIndexedMesh::btIndexedMesh(&local_50);
  local_50.m_numTriangles = 0;
  local_50.m_numVertices = 0;
  local_50.m_indexType = PHY_INTEGER;
  local_50.m_triangleIndexBase = (uchar *)0x0;
  local_50.m_triangleIndexStride = 0xc;
  local_50.m_vertexBase = (uchar *)0x0;
  local_50.m_vertexStride = 0x10;
  btAlignedObjectArray<btIndexedMesh>::push_back
            ((btAlignedObjectArray<btIndexedMesh> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  if ((*(byte *)(in_RDI + 0x1d) & 1) == 0) {
    iVar1 = btAlignedObjectArray<unsigned_short>::size
                      ((btAlignedObjectArray<unsigned_short> *)(in_RDI + 0x19));
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_numTriangles = iVar1 / 3;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_triangleIndexBase = (uchar *)0x0;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_indexType = PHY_SHORT;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_triangleIndexStride = 6;
  }
  else {
    iVar1 = btAlignedObjectArray<unsigned_int>::size
                      ((btAlignedObjectArray<unsigned_int> *)(in_RDI + 0x15));
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_numTriangles = iVar1 / 3;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_triangleIndexBase = (uchar *)0x0;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_indexType = PHY_INTEGER;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_triangleIndexStride = 0xc;
  }
  if ((*(byte *)((long)in_RDI + 0xe9) & 1) == 0) {
    iVar1 = btAlignedObjectArray<float>::size((btAlignedObjectArray<float> *)(in_RDI + 0x11));
    iVar1 = iVar1 / 3;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_numVertices = iVar1;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_vertexBase = (uchar *)0x0;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_vertexStride = 0xc;
  }
  else {
    iVar1 = btAlignedObjectArray<btVector3>::size((btAlignedObjectArray<btVector3> *)(in_RDI + 0xd))
    ;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_numVertices = iVar1;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_vertexBase = (uchar *)0x0;
    pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                       ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 3),0);
    pbVar2->m_vertexStride = 0x10;
  }
  return;
}

Assistant:

btTriangleMesh::btTriangleMesh (bool use32bitIndices,bool use4componentVertices)
:m_use32bitIndices(use32bitIndices),
m_use4componentVertices(use4componentVertices),
m_weldingThreshold(0.0)
{
	btIndexedMesh meshIndex;
	meshIndex.m_numTriangles = 0;
	meshIndex.m_numVertices = 0;
	meshIndex.m_indexType = PHY_INTEGER;
	meshIndex.m_triangleIndexBase = 0;
	meshIndex.m_triangleIndexStride = 3*sizeof(int);
	meshIndex.m_vertexBase = 0;
	meshIndex.m_vertexStride = sizeof(btVector3);
	m_indexedMeshes.push_back(meshIndex);

	if (m_use32bitIndices)
	{
		m_indexedMeshes[0].m_numTriangles = m_32bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_INTEGER;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(int);
	} else
	{
		m_indexedMeshes[0].m_numTriangles = m_16bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_SHORT;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(short int);
	}

	if (m_use4componentVertices)
	{
		m_indexedMeshes[0].m_numVertices = m_4componentVertices.size();
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = sizeof(btVector3);
	} else
	{
		m_indexedMeshes[0].m_numVertices = m_3componentVertices.size()/3;
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = 3*sizeof(btScalar);
	}


}